

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qboxlayout.cpp
# Opt level: O1

void __thiscall QBoxLayout::addStrut(QBoxLayout *this,int size)

{
  long lVar1;
  bool bVar2;
  QSpacerItem *pQVar3;
  int h;
  int w;
  long in_FS_OFFSET;
  QBoxLayoutItem *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QLayout).field_0x8;
  bVar2 = 1 < *(uint *)(lVar1 + 0x11c);
  if (bVar2) {
    h = 0;
    w = size;
  }
  else {
    w = 0;
    h = size;
  }
  pQVar3 = QLayoutPrivate::createSpacerItem(&this->super_QLayout,w,h,(uint)bVar2,(uint)!bVar2);
  local_28 = (QBoxLayoutItem *)operator_new(0x10);
  local_28->item = &pQVar3->super_QLayoutItem;
  local_28->stretch = 0;
  local_28->magic = true;
  QtPrivate::QPodArrayOps<QBoxLayoutItem*>::emplace<QBoxLayoutItem*&>
            ((QPodArrayOps<QBoxLayoutItem*> *)(lVar1 + 0xb0),*(qsizetype *)(lVar1 + 0xc0),&local_28)
  ;
  QList<QBoxLayoutItem_*>::end((QList<QBoxLayoutItem_*> *)(lVar1 + 0xb0));
  (**(code **)(*(long *)&this->super_QLayout + 0x70))(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QBoxLayout::addStrut(int size)
{
    Q_D(QBoxLayout);
    QLayoutItem *b;
    if (horz(d->dir))
        b = QLayoutPrivate::createSpacerItem(this, 0, size, QSizePolicy::Fixed, QSizePolicy::Minimum);
    else
        b = QLayoutPrivate::createSpacerItem(this, size, 0, QSizePolicy::Minimum, QSizePolicy::Fixed);

    QBoxLayoutItem *it = new QBoxLayoutItem(b);
    it->magic = true;
    d->list.append(it);
    invalidate();
}